

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.hpp
# Opt level: O0

Option<const_int_&> __thiscall
Lib::
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_Lib::DefaultHash>
::tryGet(Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_Lib::DefaultHash>
         *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key)

{
  bool bVar1;
  uint code_00;
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_Lib::DefaultHash>
  *in_RSI;
  OptionBase<const_int_&> in_RDI;
  Entry *entry;
  uint code;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb8;
  OptionBaseRef<const_int_*> o1;
  Entry *local_28;
  
  o1 = in_RDI.super_OptionBaseRef<const_int_*>._elem;
  code_00 = hashCode((Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_Lib::DefaultHash>
                      *)in_RDI.super_OptionBaseRef<const_int_*>._elem,in_stack_ffffffffffffffb8);
  local_28 = firstEntryForCode(in_RSI,code_00);
  do {
    bVar1 = Entry::occupied(local_28);
    if (!bVar1) {
      memset(o1._elem,0,8);
      Option<const_int_&>::Option((Option<const_int_&> *)0xa2f851);
      return (Option<const_int_&>)in_RDI.super_OptionBaseRef<const_int_*>._elem;
    }
    if (local_28->code == code_00) {
      Entry::key(local_28);
      bVar1 = DefaultHash::equals<std::__cxx11::string>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         o1._elem,in_stack_ffffffffffffffb8);
      if (bVar1) {
        Entry::value(local_28);
        Option<const_int_&>::OptionBase
                  ((Option<const_int_&> *)o1._elem,(int *)in_stack_ffffffffffffffb8);
        return (Option<const_int_&>)in_RDI.super_OptionBaseRef<const_int_*>._elem._elem;
      }
    }
    local_28 = nextEntry(in_RSI,local_28);
  } while( true );
}

Assistant:

Option<Val const&> tryGet(Key const& key) const
  {
    using Opt = Option<Val const&>;

    auto code = hashCode(key);
    Entry* entry;
    for (entry = firstEntryForCode(code); entry->occupied(); entry = nextEntry(entry)) {
      if (entry->code == code && Hash::equals(entry->key(),key)) {
        return Opt(entry->value());
      }
    }

    return Opt();
  }